

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O2

effect_object_property * effect_summarize_properties(effect *ef,int *unsummarized_count)

{
  ushort uVar1;
  effect_object_property_kind kind;
  int iVar2;
  ulong uVar3;
  timed_failure *ptVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  wchar_t wVar8;
  dice_t *pdVar9;
  dice_t *pdVar10;
  bool bVar11;
  int unsummarized;
  int *local_40;
  effect_object_property *summaries;
  
  unsummarized = 0;
  summaries = (effect_object_property *)0x0;
  pdVar10 = (dice_t *)0x0;
  local_40 = unsummarized_count;
LAB_0014244d:
  if (ef == (effect *)0x0) {
    if (local_40 != (int *)0x0) {
      *local_40 = unsummarized;
    }
    return summaries;
  }
  uVar1 = ef->index;
  switch(uVar1) {
  case 1:
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xc:
switchD_00142471_caseD_2:
    unsummarized = unsummarized + 1;
    break;
  case 8:
    wVar8 = ef->subtype;
    if ((uint)wVar8 < 0x35) {
LAB_00142526:
      summarize_cure(wVar8,&summaries,&unsummarized);
    }
    break;
  case 9:
    pdVar9 = pdVar10;
    if ((((pdVar10 == (dice_t *)0x0) && (pdVar9 = ef->dice, pdVar9 == (dice_t *)0x0)) ||
        (iVar2 = dice_evaluate(pdVar9,0,MAXIMISE,(random_value *)0x0), iVar2 < 1)) &&
       (wVar8 = ef->subtype, (uint)wVar8 < 0x35)) goto LAB_00142526;
  case 10:
  case 0xb:
    pdVar9 = pdVar10;
    if ((pdVar10 == (dice_t *)0x0) && (pdVar9 = ef->dice, pdVar9 == (dice_t *)0x0)) {
LAB_001425db:
      pdVar10 = (dice_t *)0x0;
    }
    else {
      iVar2 = dice_evaluate(pdVar9,0,MAXIMISE,(random_value *)0x0);
      if (0 < iVar2) {
        wVar8 = ef->subtype;
        uVar3 = (ulong)(uint)wVar8;
        if (uVar3 < 0x35) {
          bVar11 = timed_effects[uVar3].oflag_dup != 0;
          if (bVar11) {
            add_to_summaries(&summaries,timed_effects[uVar3].oflag_dup,0,0,
                             timed_effects[uVar3].oflag_syn ^ EFPROP_OBJECT_FLAG);
            wVar8 = ef->subtype;
          }
          lVar5 = (long)wVar8;
          iVar2 = timed_effects[lVar5].temp_resist;
          if (-1 < iVar2) {
            ptVar4 = (timed_failure *)&timed_effects[lVar5].fail;
            iVar7 = 200;
            iVar6 = 10;
            while (ptVar4 = ptVar4->next, ptVar4 != (timed_failure *)0x0) {
              if (ptVar4->idx == iVar2) {
                if (ptVar4->code == 2) {
                  iVar6 = 0x51;
                }
                else if (ptVar4->code == 3) {
                  iVar7 = 100;
                }
              }
            }
            add_to_summaries(&summaries,iVar2,iVar6,iVar7,EFPROP_RESIST);
            lVar5 = (long)ef->subtype;
            bVar11 = true;
          }
          ptVar4 = (timed_failure *)&timed_effects[lVar5].fail;
LAB_00142605:
          ptVar4 = ptVar4->next;
          if (ptVar4 == (timed_failure *)0x0) goto LAB_0014267d;
          iVar2 = ptVar4->code;
          if (iVar2 == 2) goto LAB_00142651;
          if (iVar2 == 3) {
            iVar2 = ptVar4->idx;
            if (iVar2 != timed_effects[ef->subtype].temp_resist) {
              iVar7 = 0;
              iVar6 = 100;
              kind = EFPROP_CONFLICT_VULN;
              goto LAB_00142671;
            }
            goto LAB_00142605;
          }
          if (iVar2 != 1) goto LAB_00142605;
          iVar2 = ptVar4->idx;
          iVar7 = 0;
          iVar6 = 0;
          kind = EFPROP_CONFLICT_FLAG;
          goto LAB_00142671;
        }
      }
    }
    break;
  case 0xd:
    pdVar9 = pdVar10;
    if ((pdVar10 != (dice_t *)0x0) || (pdVar9 = ef->dice, pdVar9 != (dice_t *)0x0)) {
      iVar2 = dice_evaluate(pdVar9,0,MAXIMISE,(random_value *)0x0);
      if (0 < iVar2) {
        wVar8 = ef->subtype;
        goto LAB_00142526;
      }
      break;
    }
    goto LAB_001425db;
  default:
    if (uVar1 - 0x3b < 3) {
      add_to_summaries(&summaries,0x1d,0,0,EFPROP_CONFLICT_FLAG);
    }
    else if (uVar1 != 0x7a) {
      if (uVar1 == 0x7c) goto LAB_001425db;
      if (uVar1 != 0x7b) goto switchD_00142471_caseD_2;
      pdVar10 = ef->dice;
    }
  }
  goto switchD_00142471_caseD_1;
LAB_0014267d:
  if (timed_effects[ef->subtype].temp_brand < 0) {
    iVar2 = timed_effects[ef->subtype].temp_slay;
    if (iVar2 < 0) {
      if (!bVar11) {
        unsummarized = unsummarized + 1;
      }
      goto switchD_00142471_caseD_1;
    }
  }
  else {
    add_to_summaries(&summaries,timed_effects[ef->subtype].temp_brand,0,0,EFPROP_BRAND);
    iVar2 = timed_effects[ef->subtype].temp_slay;
    if (iVar2 < 0) goto switchD_00142471_caseD_1;
  }
  add_to_summaries(&summaries,iVar2,0,0,EFPROP_SLAY);
switchD_00142471_caseD_1:
  ef = ef->next;
  goto LAB_0014244d;
LAB_00142651:
  iVar2 = ptVar4->idx;
  if (iVar2 == timed_effects[ef->subtype].temp_resist) goto LAB_00142605;
  iVar7 = 0x51;
  iVar6 = 200;
  kind = EFPROP_CONFLICT_RESIST;
LAB_00142671:
  add_to_summaries(&summaries,iVar2,iVar7,iVar6,kind);
  bVar11 = true;
  goto LAB_00142605;
}

Assistant:

struct effect_object_property *effect_summarize_properties(
		const struct effect *ef, int *unsummarized_count)
{
	int unsummarized = 0;
	struct effect_object_property *summaries = NULL;
	dice_t *remembered_dice = NULL;

	for (; ef; ef = ef->next) {
		int value_this;

		switch (ef->index) {
		case EF_RANDOM:
		case EF_SELECT:
			/*
			 * For random or select effects, summarize all of the
			 * subeffects since any of them is possible.  That's
			 * equivalent to simply skipping over the random or
			 * select effect and stepping one by one through what
			 * follows.
			 */
			break;

		case EF_SET_VALUE:
			/*
			 * Remember the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = ef->dice;
			break;

		case EF_CLEAR_VALUE:
			/*
			 * Forget the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = NULL;
			break;

		case EF_CURE:
			if (ef->subtype >= 0 && ef->subtype < TMD_MAX) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TIMED_SET:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this <= 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				/* It's equivalent to a cure. */
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
				break;
			}
			/* Fall through. */

		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this > 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				bool summarized = false;
				const struct timed_failure *f;

				if (timed_effects[ef->subtype].oflag_dup !=
						OF_NONE) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].oflag_dup,
						0, 0,
						timed_effects[ef->subtype].oflag_syn ?
						EFPROP_OBJECT_FLAG_EXACT : EFPROP_OBJECT_FLAG);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_resist >= 0) {
					/*
					 * At RES_LEVEL_BASE, the benefit from
					 * RES_BOOST_NORMAL is a drop of 40
					 * in the resistance level.  When the
					 * benefit drops to less than a 1/10th
					 * of that say that there's limited
					 * benefit.  That happens when the
					 * resistance level is less than 10.
					 */
					int rmin = 10, rmax = RES_LEVEL_MIN;

					f = timed_effects[ef->subtype].fail;
					while (f) {
						if (f->idx == timed_effects[ef->subtype].temp_resist) {
							if (f->code == TMD_FAIL_FLAG_RESIST) {
								rmin = MAX(rmin, RES_LEVEL_EFFECT + 1);
							} else if (f->code == TMD_FAIL_FLAG_VULN) {
								rmax = MIN(rmax, RES_LEVEL_BASE);
							}
						}
						f = f->next;
					}
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_resist,
						rmin, rmax, EFPROP_RESIST);
					summarized = true;
				}
				f = timed_effects[ef->subtype].fail;
				while (f) {
					switch (f->code) {
					case TMD_FAIL_FLAG_OBJECT:
						add_to_summaries(&summaries,
							f->idx, 0, 0,
							EFPROP_CONFLICT_FLAG);
						summarized = true;
						break;

					case TMD_FAIL_FLAG_RESIST:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_EFFECT + 1,
								RES_LEVEL_MIN,
								EFPROP_CONFLICT_RESIST);
							summarized = true;
						}
						break;

					case TMD_FAIL_FLAG_VULN:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_MAX,
								RES_LEVEL_BASE,
								EFPROP_CONFLICT_VULN);
							summarized = true;
						}
						break;

					default:
						/* Nothing special is needed. */
						break;
					}
					f = f->next;
				}
				if (timed_effects[ef->subtype].temp_brand >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_brand,
						0, 0, EFPROP_BRAND);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_slay >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_slay,
						0, 0, EFPROP_SLAY);
					summarized = true;
				}
				if (!summarized) ++unsummarized;
			}
			break;

		case EF_TIMED_DEC:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			/* If it decreases the duration, it's a partial cure. */
			if (value_this > 0) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TELEPORT:
		case EF_TELEPORT_TO:
		case EF_TELEPORT_LEVEL:
			add_to_summaries(&summaries, OF_NO_TELEPORT,
				0, 0, EFPROP_CONFLICT_FLAG);
			break;

		/*
		 * There's other effects that have limited utility when the
		 * object already has some flags:
		 * DISABLE_TRAPS with OF_TRAP_IMMUNE is only good for unlocking
		 * DETECT_INVISIBLE with OF_SEE_INVISIBLE or OF_TELEPATHY
		 * RESTORE_x with OF_SUST_x
		 * RESTORE_EXP with OF_HOLD_LIFE
		 * For now, don't try to flag those.
		 */
		default:
			/*
			 * Everything else isn't related to an object property.
			 */
			++unsummarized;
			break;
		}
	}

	if (unsummarized_count) *unsummarized_count = unsummarized;
	return summaries;
}